

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.c
# Opt level: O0

int jsmn_parse_primitive
              (jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,size_t num_tokens)

{
  uint start_00;
  int iVar1;
  jsmntok_t *token_00;
  jsmntok_t *in_RCX;
  ulong in_RDX;
  long in_RSI;
  jsmn_parser *in_RDI;
  size_t in_R8;
  bool bVar2;
  int start;
  jsmntok_t *token;
  
  start_00 = in_RDI->pos;
  while( true ) {
    bVar2 = false;
    if (in_RDI->pos < in_RDX) {
      bVar2 = *(char *)(in_RSI + (ulong)in_RDI->pos) != '\0';
    }
    if (((((!bVar2) || (iVar1 = (int)*(char *)(in_RSI + (ulong)in_RDI->pos), iVar1 - 9U < 2)) ||
         (iVar1 == 0xd)) || ((iVar1 == 0x20 || (iVar1 == 0x2c)))) ||
       ((iVar1 == 0x3a || ((iVar1 == 0x5d || (iVar1 == 0x7d)))))) break;
    if ((*(char *)(in_RSI + (ulong)in_RDI->pos) < ' ') ||
       ('~' < *(char *)(in_RSI + (ulong)in_RDI->pos))) {
      in_RDI->pos = start_00;
      return -2;
    }
    in_RDI->pos = in_RDI->pos + 1;
  }
  if (in_RCX == (jsmntok_t *)0x0) {
    in_RDI->pos = in_RDI->pos - 1;
    return 0;
  }
  token_00 = jsmn_alloc_token(in_RDI,in_RCX,in_R8);
  if (token_00 == (jsmntok_t *)0x0) {
    in_RDI->pos = start_00;
    return -1;
  }
  jsmn_fill_token(token_00,JSMN_PRIMITIVE,start_00,in_RDI->pos);
  in_RDI->pos = in_RDI->pos - 1;
  return 0;
}

Assistant:

static int jsmn_parse_primitive(jsmn_parser *parser, const char *js,
		size_t len, jsmntok_t *tokens, size_t num_tokens) {
	jsmntok_t *token;
	int start;

	start = parser->pos;

	for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
		switch (js[parser->pos]) {
#ifndef JSMN_STRICT
			/* In strict mode primitive must be followed by "," or "}" or "]" */
			case ':':
#endif
			case '\t' : case '\r' : case '\n' : case ' ' :
			case ','  : case ']'  : case '}' :
				goto found;
		}
		if (js[parser->pos] < 32 || js[parser->pos] >= 127) {
			parser->pos = start;
			return JSMN_ERROR_INVAL;
		}
	}
#ifdef JSMN_STRICT
	/* In strict mode primitive must be followed by a comma/object/array */
	parser->pos = start;
	return JSMN_ERROR_PART;
#endif

found:
	if (tokens == NULL) {
		parser->pos--;
		return 0;
	}
	token = jsmn_alloc_token(parser, tokens, num_tokens);
	if (token == NULL) {
		parser->pos = start;
		return JSMN_ERROR_NOMEM;
	}
	jsmn_fill_token(token, JSMN_PRIMITIVE, start, parser->pos);
#ifdef JSMN_PARENT_LINKS
	token->parent = parser->toksuper;
#endif
	parser->pos--;
	return 0;
}